

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_prtyd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 ret_00;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8));
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,arg1,0x20);
  tcg_gen_xor_i64_ppc64(tcg_ctx,ret,arg1,ret_00);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,ret,0x10);
  tcg_gen_xor_i64_ppc64(tcg_ctx,ret,ret,ret_00);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,ret,8);
  tcg_gen_xor_i64_ppc64(tcg_ctx,ret,ret,ret_00);
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,1);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_prtyd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv ra = cpu_gpr[rA(ctx->opcode)];
    TCGv rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_shri_tl(tcg_ctx, t0, rs, 32);
    tcg_gen_xor_tl(tcg_ctx, ra, rs, t0);
    tcg_gen_shri_tl(tcg_ctx, t0, ra, 16);
    tcg_gen_xor_tl(tcg_ctx, ra, ra, t0);
    tcg_gen_shri_tl(tcg_ctx, t0, ra, 8);
    tcg_gen_xor_tl(tcg_ctx, ra, ra, t0);
    tcg_gen_andi_tl(tcg_ctx, ra, ra, 1);
    tcg_temp_free(tcg_ctx, t0);
}